

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_cps(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 ret;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_andi_i64_s390x(tcg_ctx,ret,o->in1,-0x8000000000000000);
  tcg_gen_andi_i64_s390x(tcg_ctx,o->out,o->in2,0x7fffffffffffffff);
  tcg_gen_or_i64_s390x(tcg_ctx,o->out,o->out,ret);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_cps(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_andi_i64(tcg_ctx, t, o->in1, 0x8000000000000000ull);
    tcg_gen_andi_i64(tcg_ctx, o->out, o->in2, 0x7fffffffffffffffull);
    tcg_gen_or_i64(tcg_ctx, o->out, o->out, t);
    tcg_temp_free_i64(tcg_ctx, t);
    return DISAS_NEXT;
}